

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lyp_check_pattern(ly_ctx *ctx,char *pattern,pcre **pcre_precomp)

{
  char cVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  void *__ptr;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  char *(*papcVar10) [2];
  uint uVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  char *local_60;
  char *err_msg;
  ulong local_50;
  int local_44;
  char *pcStack_40;
  int err_offset;
  ly_ctx *local_38;
  
  err_msg = (char *)pcre_precomp;
  local_38 = ctx;
  pcVar4 = strchr(pattern,0x24);
  lVar13 = 4;
  while (pcVar4 != (char *)0x0) {
    pcVar4 = strchr(pcVar4 + 1,0x24);
    lVar13 = lVar13 + 1;
  }
  sVar5 = strlen(pattern);
  pcVar4 = (char *)malloc(lVar13 + sVar5);
  if (pcVar4 != (char *)0x0) {
    *pcVar4 = '\0';
    iVar3 = strncmp(pattern + (sVar5 - 2),".*",2);
    pcVar6 = pattern;
    pcVar9 = pcVar4;
    if (iVar3 != 0) {
      *pcVar4 = '(';
      pcVar9 = pcVar4 + 1;
    }
    do {
      cVar1 = *pcVar6;
      if (cVar1 == '$') {
        pcVar9[2] = '\0';
        pcVar9[0] = '\\';
        pcVar9[1] = '$';
        lVar13 = 2;
      }
      else {
        if (cVar1 == '\0') goto LAB_00124578;
        *pcVar9 = cVar1;
        lVar13 = 1;
      }
      pcVar6 = pcVar6 + 1;
      pcVar9 = pcVar9 + lVar13;
    } while( true );
  }
LAB_00124780:
  ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyp_check_pattern");
  return 1;
LAB_00124578:
  sVar5 = strlen(pattern);
  iVar3 = strncmp(pattern + (sVar5 - 2),".*",2);
  pcStack_40 = pattern;
  if (iVar3 == 0) {
    *pcVar9 = '\0';
  }
  else {
    pcVar9[2] = '\0';
    pcVar9[0] = ')';
    pcVar9[1] = '$';
  }
  do {
    pcVar6 = strstr(pcVar4,"\\p{Is");
    if (pcVar6 == (char *)0x0) {
      __ptr = (void *)pcre_compile(pcVar4,0x1030,&local_60,&local_44,0);
      if (__ptr == (void *)0x0) {
        pcVar6 = pcVar4 + local_44;
LAB_00124821:
        ly_vlog(local_38,LYE_INREGEX,LY_VLOG_NONE,(void *)0x0,pcStack_40,pcVar6,local_60);
        free(pcVar4);
        iVar3 = 1;
      }
      else {
        free(pcVar4);
        if (err_msg == (char *)0x0) {
          free(__ptr);
        }
        else {
          *(void **)err_msg = __ptr;
        }
        iVar3 = 0;
      }
      return iVar3;
    }
    uVar11 = (int)pcVar6 - (int)pcVar4;
    pcVar6 = strchr(pcVar6,0x7d);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = pcVar4 + (long)(int)uVar11 + 2;
      local_60 = "unterminated character property";
      goto LAB_00124821;
    }
    uVar12 = ((int)pcVar6 - (int)pcVar4) + 1;
    iVar3 = uVar12 - uVar11;
    if (iVar3 < 0x13) {
      sVar5 = strlen(pcVar4);
      pcVar4 = (char *)ly_realloc(pcVar4,(0x13 - iVar3) + sVar5 + 1);
      if (pcVar4 == (char *)0x0) goto LAB_00124780;
    }
    local_50 = (ulong)uVar12;
    iVar3 = strncmp(pcVar4 + (long)(int)uVar11 + 5,"BasicLatin",10);
    if (iVar3 == 0) {
      bVar14 = false;
      papcVar10 = lyp_ublock2urange;
    }
    else {
      lVar13 = 0;
      do {
        lVar7 = lVar13;
        if (lVar7 + 0x10 == 0x530) goto LAB_001247ab;
        pcVar6 = *(char **)((long)lyp_ublock2urange[1] + lVar7);
        sVar5 = strlen(pcVar6);
        iVar3 = strncmp(pcVar4 + (long)(int)uVar11 + 5,pcVar6,sVar5);
        lVar13 = lVar7 + 0x10;
      } while (iVar3 != 0);
      bVar14 = pcVar6 == (char *)0x0;
      papcVar10 = (char *(*) [2])(lVar7 + 0x1ce7e0);
    }
    if (bVar14) {
LAB_001247ab:
      pcVar6 = pcVar4 + (long)(int)uVar11 + 5;
      local_60 = "unknown block name";
      goto LAB_00124821;
    }
    if ((int)uVar11 < 1) {
LAB_00124737:
      pcVar6 = pcVar4 + (int)uVar11;
      lVar13 = (long)(int)local_50;
      sVar5 = strlen(pcVar4 + lVar13);
      memmove(pcVar6 + 0x13,pcVar4 + lVar13,sVar5 + 1);
      pcVar9 = (*papcVar10)[1];
      uVar2 = *(undefined8 *)(pcVar9 + 8);
      *(undefined8 *)pcVar6 = *(undefined8 *)pcVar9;
      *(undefined8 *)(pcVar6 + 8) = uVar2;
      *(undefined4 *)(pcVar6 + 0xf) = *(undefined4 *)(pcVar9 + 0xf);
    }
    else {
      uVar8 = 0;
      iVar3 = 0;
      do {
        if ((pcVar4[uVar8] == '[') && ((uVar8 == 0 || (pcVar4[uVar8 - 1] != '\\')))) {
          iVar3 = iVar3 + 1;
        }
        if ((pcVar4[uVar8] == ']') && ((uVar8 == 0 || (pcVar4[uVar8 - 1] != '\\')))) {
          iVar3 = iVar3 + -1;
        }
        uVar8 = uVar8 + 1;
      } while ((uVar11 & 0x7fffffff) != uVar8);
      if (iVar3 == 0) goto LAB_00124737;
      pcVar6 = pcVar4 + (uVar11 & 0x7fffffff);
      lVar13 = (long)(int)local_50;
      sVar5 = strlen(pcVar4 + lVar13);
      memmove(pcVar6 + 0x11,pcVar4 + lVar13,sVar5 + 1);
      pcVar9 = (*papcVar10)[1];
      uVar2 = *(undefined8 *)(pcVar9 + 9);
      *(undefined8 *)pcVar6 = *(undefined8 *)(pcVar9 + 1);
      *(undefined8 *)(pcVar6 + 8) = uVar2;
      pcVar6[0x10] = pcVar9[0x11];
    }
  } while( true );
}

Assistant:

int
lyp_check_pattern(struct ly_ctx *ctx, const char *pattern, pcre **pcre_precomp)
{
    int idx, idx2, start, end, err_offset, count;
    char *perl_regex, *ptr;
    const char *err_msg, *orig_ptr;
    pcre *precomp;

    /*
     * adjust the expression to a Perl equivalent
     *
     * http://www.w3.org/TR/2004/REC-xmlschema-2-20041028/#regexs
     */

    /* we need to replace all "$" with "\$", count them now */
    for (count = 0, ptr = strchr(pattern, '$'); ptr; ++count, ptr = strchr(ptr + 1, '$'));

    perl_regex = malloc((strlen(pattern) + 4 + count) * sizeof(char));
    LY_CHECK_ERR_RETURN(!perl_regex, LOGMEM(ctx), EXIT_FAILURE);
    perl_regex[0] = '\0';

    ptr = perl_regex;

    if (strncmp(pattern + strlen(pattern) - 2, ".*", 2)) {
        /* we wil add line-end anchoring */
        ptr[0] = '(';
        ++ptr;
    }

    for (orig_ptr = pattern; orig_ptr[0]; ++orig_ptr) {
        if (orig_ptr[0] == '$') {
            ptr += sprintf(ptr, "\\$");
        } else {
            ptr[0] = orig_ptr[0];
            ++ptr;
        }
    }

    if (strncmp(pattern + strlen(pattern) - 2, ".*", 2)) {
        ptr += sprintf(ptr, ")$");
    } else {
        ptr[0] = '\0';
        ++ptr;
    }

    /* substitute Unicode Character Blocks with exact Character Ranges */
    while ((ptr = strstr(perl_regex, "\\p{Is"))) {
        start = ptr - perl_regex;

        ptr = strchr(ptr, '}');
        if (!ptr) {
            LOGVAL(ctx, LYE_INREGEX, LY_VLOG_NONE, NULL, pattern, perl_regex + start + 2, "unterminated character property");
            free(perl_regex);
            return EXIT_FAILURE;
        }

        end = (ptr - perl_regex) + 1;

        /* need more space */
        if (end - start < LYP_URANGE_LEN) {
            perl_regex = ly_realloc(perl_regex, strlen(perl_regex) + (LYP_URANGE_LEN - (end - start)) + 1);
            LY_CHECK_ERR_RETURN(!perl_regex, LOGMEM(ctx); free(perl_regex), EXIT_FAILURE);
        }

        /* find our range */
        for (idx = 0; lyp_ublock2urange[idx][0]; ++idx) {
            if (!strncmp(perl_regex + start + 5, lyp_ublock2urange[idx][0], strlen(lyp_ublock2urange[idx][0]))) {
                break;
            }
        }
        if (!lyp_ublock2urange[idx][0]) {
            LOGVAL(ctx, LYE_INREGEX, LY_VLOG_NONE, NULL, pattern, perl_regex + start + 5, "unknown block name");
            free(perl_regex);
            return EXIT_FAILURE;
        }

        /* make the space in the string and replace the block (but we cannot include brackets if it was already enclosed in them) */
        for (idx2 = 0, count = 0; idx2 < start; ++idx2) {
            if ((perl_regex[idx2] == '[') && (!idx2 || (perl_regex[idx2 - 1] != '\\'))) {
                ++count;
            }
            if ((perl_regex[idx2] == ']') && (!idx2 || (perl_regex[idx2 - 1] != '\\'))) {
                --count;
            }
        }
        if (count) {
            /* skip brackets */
            memmove(perl_regex + start + (LYP_URANGE_LEN - 2), perl_regex + end, strlen(perl_regex + end) + 1);
            memcpy(perl_regex + start, lyp_ublock2urange[idx][1] + 1, LYP_URANGE_LEN - 2);
        } else {
            memmove(perl_regex + start + LYP_URANGE_LEN, perl_regex + end, strlen(perl_regex + end) + 1);
            memcpy(perl_regex + start, lyp_ublock2urange[idx][1], LYP_URANGE_LEN);
        }
    }

    /* must return 0, already checked during parsing */
    precomp = pcre_compile(perl_regex, PCRE_ANCHORED | PCRE_DOLLAR_ENDONLY | PCRE_NO_AUTO_CAPTURE,
                           &err_msg, &err_offset, NULL);
    if (!precomp) {
        LOGVAL(ctx, LYE_INREGEX, LY_VLOG_NONE, NULL, pattern, perl_regex + err_offset, err_msg);
        free(perl_regex);
        return EXIT_FAILURE;
    }
    free(perl_regex);

    if (pcre_precomp) {
        *pcre_precomp = precomp;
    } else {
        free(precomp);
    }

    return EXIT_SUCCESS;
}